

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O1

void vociadd(voccxdef *ctx,objnum obj,objnum loc,int numsc,objnum *sc,int flags)

{
  anon_union_8_2_176b10ea_for_vociu *paVar1;
  byte bVar2;
  vocidef *in_RAX;
  vocidef **__s;
  vocidef *pvVar3;
  uchar *puVar4;
  uint uVar5;
  vocidef *pvVar6;
  ulong uVar7;
  vocidef *pvVar8;
  uint uVar9;
  undefined6 in_register_00000032;
  vocidef *pvVar10;
  vocidef *pvVar11;
  
  uVar7 = CONCAT62(in_register_00000032,obj) >> 8 & 0xffffff;
  if (ctx->voccxinh[uVar7] == (vocidef **)0x0) {
    __s = (vocidef **)mchalo(ctx->voccxerr,0x800,"vocialo");
    ctx->voccxinh[uVar7] = __s;
    in_RAX = (vocidef *)memset(__s,0,0x800);
  }
  if (ctx->voccxifr == (vocidef *)0x0) {
    pvVar3 = in_RAX;
    pvVar11 = (vocidef *)0x0;
  }
  else {
    pvVar10 = (vocidef *)0x0;
    pvVar6 = (vocidef *)0x0;
    pvVar8 = ctx->voccxifr;
    do {
      bVar2 = pvVar8->vocinsc;
      pvVar3 = pvVar6;
      pvVar11 = pvVar8;
      if ((uint)bVar2 == numsc) break;
      if ((numsc < (int)(uint)bVar2) && ((pvVar10 == (vocidef *)0x0 || (bVar2 < pvVar10->vocinsc))))
      {
        in_RAX = pvVar6;
        pvVar10 = pvVar8;
      }
      paVar1 = &pvVar8->vociu;
      pvVar3 = in_RAX;
      pvVar6 = pvVar8;
      pvVar8 = paVar1->vociunxt;
      pvVar11 = pvVar10;
    } while (paVar1->vociunxt != (vocidef *)0x0);
  }
  if (pvVar11 == (vocidef *)0x0) {
    uVar9 = numsc * 2 + 0x15U & 0xfffffff8;
    if (0x1fff < ctx->voccxilst + uVar9) {
      puVar4 = mchalo(ctx->voccxerr,0x2000,"vociadd");
      uVar5 = ctx->voccxiplst + 1;
      ctx->voccxiplst = uVar5;
      ctx->voccxip[uVar5] = puVar4;
      ctx->voccxilst = 0;
    }
    pvVar11 = (vocidef *)(ctx->voccxip[ctx->voccxiplst] + ctx->voccxilst);
    ctx->voccxilst = uVar9 + ctx->voccxilst;
  }
  else if (pvVar3 == (vocidef *)0x0) {
    ctx->voccxifr = (vocidef *)pvVar11->vociu;
  }
  else {
    pvVar3->vociu = pvVar11->vociu;
  }
  if (ctx->voccxinh[obj >> 8][(ulong)obj & 0xff] != (vocidef *)0x0) {
    errsigf(ctx->voccxerr,"TADS",0x1c2);
  }
  (pvVar11->vociu).vocius.vociusloc = loc;
  (pvVar11->vociu).vocius.vociusilc = 0xffff;
  (pvVar11->vociu).vocius.vociusflg = (byte)flags & 0xfb;
  pvVar11->vocinsc = (uchar)numsc;
  if (numsc != 0) {
    if ((flags & 4U) == 0) {
      memcpy((void *)((long)&pvVar11->vociu + 6),sc,(long)numsc * 2);
    }
    else if (0 < numsc) {
      uVar7 = 0;
      do {
        *(objnum *)((long)&pvVar11->vociu + uVar7 * 2 + 6) = sc[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uint)numsc != uVar7);
    }
  }
  ctx->voccxinh[obj >> 8][(ulong)obj & 0xff] = pvVar11;
  return;
}

Assistant:

void vociadd(voccxdef *ctx, objnum obj, objnum loc,
             int numsc, objnum *sc, int flags)
{
    vocidef *v;
    vocidef *min;
    vocidef *prv;
    vocidef *minprv;

    /* make sure we have a page table entry for this object */
    vocialo(ctx, obj);

    /* look in free list for an entry that's big enough */
    for (prv = (vocidef *)0, min = (vocidef *)0, v = ctx->voccxifr ; v ;
         prv = v, v = v->vocinxt)
    {
        if (v->vocinsc == numsc)
        {
            min = v;
            minprv = prv;
            break;
        }
        else if (v->vocinsc > numsc)
        {
            if (!min || v->vocinsc < min->vocinsc)
            {
                min = v;
                minprv = prv;
            }
        }
    }
    
    if (!min)
    {
        uint need;
        
        /* nothing in free list; allocate a new entry */
        need = osrndsz(sizeof(vocidef) + (numsc - 1)*sizeof(objnum));
        if (ctx->voccxilst + need >= VOCISIZ)
        {
            /* nothing left on current page; allocate a new page */
            ctx->voccxip[++(ctx->voccxiplst)] =
                mchalo(ctx->voccxerr, VOCISIZ, "vociadd");
            ctx->voccxilst = 0;
        }

        /* allocate space out of current page */
        v = (vocidef *)(ctx->voccxip[ctx->voccxiplst] + ctx->voccxilst);
        ctx->voccxilst += need;
    }
    else
    {
        /* unlink from chain and use */
        v = min;
        if (minprv)
            minprv->vocinxt = v->vocinxt;
        else
            ctx->voccxifr = v->vocinxt;
    }

    /* set up the entry */
    if (vocinh(ctx, obj) != (vocidef *)0) errsig(ctx->voccxerr, ERR_VOCINUS);
    v->vociloc = loc;
    v->vociilc = MCMONINV;
    v->vociflg = (flags & ~VOCIFXLAT);
    v->vocinsc = numsc;
    if (numsc)
    {
        if (flags & VOCIFXLAT)
        {
            int i;
            
            for (i = 0 ; i < numsc ; ++i)
                v->vocisc[i] = osrp2(&sc[i]);
        }
        else
            memcpy(v->vocisc, sc, (size_t)(numsc * sizeof(objnum)));
    }
    vocinh(ctx, obj) = v;                           /* set page table entry */
}